

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O1

tmsize_t TIFFReadRawTile(TIFF *tif,uint32_t tile,void *buf,tmsize_t size)

{
  int iVar1;
  uint64_t val;
  tmsize_t tVar2;
  
  iVar1 = TIFFCheckRead(tif,1);
  if (iVar1 != 0) {
    if (tile < (tif->tif_dir).td_nstrips) {
      if ((tif->tif_flags & 0x20000) == 0) {
        val = TIFFGetStrileByteCount(tif,tile);
        if (val < (ulong)size || size == -1) {
          size = _TIFFCastUInt64ToSSize(tif,val,"TIFFReadRawTile");
        }
        if (size != 0) {
          tVar2 = TIFFReadRawTile1(tif,tile,buf,size,"TIFFReadRawTile");
          return tVar2;
        }
      }
      else {
        TIFFErrorExtR(tif,"TIFFReadRawTile",
                      "Compression scheme does not support access to raw uncompressed data");
      }
    }
    else {
      TIFFErrorExtR(tif,"TIFFReadRawTile","%u: Tile out of range, max %u",tile);
    }
  }
  return -1;
}

Assistant:

tmsize_t TIFFReadRawTile(TIFF *tif, uint32_t tile, void *buf, tmsize_t size)
{
    static const char module[] = "TIFFReadRawTile";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t bytecount64;
    tmsize_t bytecountm;

    if (!TIFFCheckRead(tif, 1))
        return ((tmsize_t)(-1));
    if (tile >= td->td_nstrips)
    {
        TIFFErrorExtR(tif, module,
                      "%" PRIu32 ": Tile out of range, max %" PRIu32, tile,
                      td->td_nstrips);
        return ((tmsize_t)(-1));
    }
    if (tif->tif_flags & TIFF_NOREADRAW)
    {
        TIFFErrorExtR(tif, module,
                      "Compression scheme does not support access to raw "
                      "uncompressed data");
        return ((tmsize_t)(-1));
    }
    bytecount64 = TIFFGetStrileByteCount(tif, tile);
    if (size != (tmsize_t)(-1) && (uint64_t)size <= bytecount64)
        bytecountm = size;
    else
        bytecountm = _TIFFCastUInt64ToSSize(tif, bytecount64, module);
    if (bytecountm == 0)
    {
        return ((tmsize_t)(-1));
    }
    return (TIFFReadRawTile1(tif, tile, buf, bytecountm, module));
}